

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# artifact.c
# Opt level: O0

void strip_oprops(obj *otmp)

{
  uint local_14;
  uint which;
  obj *otmp_local;
  
  if ((otmp != (obj *)0x0) && (otmp->oprops != 0)) {
    if ((otmp == uwep) || (otmp == uswapwep)) {
      set_artifact_intrinsic(otmp,'\0',(long)otmp->owornmask,'\x01');
    }
    else {
      local_14 = (uint)(otmp == uarm);
      if (otmp == uarmu) {
        local_14 = 0x40;
      }
      if (otmp == uarmc) {
        local_14 = 2;
      }
      if (otmp == uarmh) {
        local_14 = 4;
      }
      if (otmp == uarms) {
        local_14 = 8;
      }
      if (otmp == uarmg) {
        local_14 = 0x10;
      }
      if (otmp == uarmf) {
        local_14 = 0x20;
      }
      if (otmp == uamul) {
        local_14 = 0x10000;
      }
      if (otmp == uleft) {
        local_14 = 0x20000;
      }
      if (otmp == uright) {
        local_14 = 0x40000;
      }
      if (local_14 != 0) {
        Oprops_off(otmp,local_14);
      }
    }
    otmp->oprops_known = 0;
    otmp->oprops = 0;
  }
  return;
}

Assistant:

static void strip_oprops(struct obj *otmp)
{
	if (!otmp || !otmp->oprops)
	    return;

	if (otmp == uwep || otmp == uswapwep) {
	    set_artifact_intrinsic(otmp, FALSE, otmp->owornmask, TRUE);
	} else {
	    unsigned int which = 0;
	    if (otmp == uarm) which = W_ARM;
	    if (otmp == uarmu) which = W_ARMU;
	    if (otmp == uarmc) which = W_ARMC;
	    if (otmp == uarmh) which = W_ARMH;
	    if (otmp == uarms) which = W_ARMS;
	    if (otmp == uarmg) which = W_ARMG;
	    if (otmp == uarmf) which = W_ARMF;
	    if (otmp == uamul) which = W_AMUL;
	    if (otmp == uleft) which = W_RINGL;
	    if (otmp == uright) which = W_RINGR;
	    if (which != 0) Oprops_off(otmp, which);
	}

	otmp->oprops = otmp->oprops_known = 0L;
}